

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteCollectionCacheRemoveRecord(unqlite_col *pCol,jx9_int64 nId)

{
  sxu32 sVar1;
  unqlite_col_record *puVar2;
  unqlite_col_record *puVar3;
  uint uVar4;
  
  sVar1 = pCol->nRec;
  if (sVar1 != 0) {
    uVar4 = pCol->nRecSize - 1;
    for (puVar2 = pCol->apRecord[(uint)nId & uVar4]; puVar2 != (unqlite_col_record *)0x0;
        puVar2 = puVar2->pNextCol) {
      if (puVar2->nId == nId) {
        if (puVar2->pPrevCol == (unqlite_col_record *)0x0) {
          puVar3 = puVar2->pNextCol;
          pCol->apRecord[uVar4 & (uint)nId] = puVar3;
        }
        else {
          puVar3 = puVar2->pNextCol;
          puVar2->pPrevCol->pNextCol = puVar3;
        }
        if (puVar3 != (unqlite_col_record *)0x0) {
          puVar3->pPrevCol = puVar2->pPrevCol;
        }
        if (pCol->pList == puVar2) {
          pCol->pList = pCol->pList->pNext;
        }
        puVar3 = puVar2->pNext;
        puVar2 = puVar2->pPrev;
        if (puVar2 != (unqlite_col_record *)0x0) {
          puVar2->pNext = puVar3;
        }
        if (puVar3 != (unqlite_col_record *)0x0) {
          puVar3->pPrev = puVar2;
        }
        pCol->nRec = sVar1 - 1;
        return sVar1 - 1;
      }
    }
  }
  return sVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionCacheRemoveRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pRecord;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord == 0 ){
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	if( pRecord->pPrevCol ){
		pRecord->pPrevCol->pNextCol = pRecord->pNextCol;
	}else{
		sxu32 iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
		pCol->apRecord[iBucket] = pRecord->pNextCol;
	}
	if( pRecord->pNextCol ){
		pRecord->pNextCol->pPrevCol = pRecord->pPrevCol;
	}
	/* Unlink */
	MACRO_LD_REMOVE(pCol->pList,pRecord);
	pCol->nRec--;
	return UNQLITE_OK;
}